

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O3

void __thiscall SkipList::SkipList(SkipList *this)

{
  vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_> *pvVar1;
  pointer ppEVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  value_type *__val;
  pointer ppEVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  allocator_type local_19;
  
  this->MAX_HEIGHT = 0x10;
  this->INF = 0x7fffffff;
  (this->head).value = 0;
  std::vector<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>::vector
            (&(this->head).next,0x11,&local_19);
  (this->tail).value = this->INF;
  pvVar1 = &(this->tail).next;
  (pvVar1->super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tail).next.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppEVar5 = (pointer)operator_new(8);
  (this->tail).next.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_start = ppEVar5;
  (this->tail).next.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = ppEVar5 + 1;
  *ppEVar5 = (Element *)0x0;
  (this->tail).next.super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppEVar5 + 1;
  this->height = 0;
  auVar4 = _DAT_0010a020;
  auVar3 = _DAT_0010a010;
  ppEVar5 = (this->head).next.
            super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar2 = (this->head).next.
            super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar5 != ppEVar2) {
    uVar6 = (long)ppEVar2 + (-8 - (long)ppEVar5);
    auVar10._8_4_ = (int)uVar6;
    auVar10._0_8_ = uVar6;
    auVar10._12_4_ = (int)(uVar6 >> 0x20);
    auVar8._0_8_ = uVar6 >> 3;
    auVar8._8_8_ = auVar10._8_8_ >> 3;
    uVar7 = 0;
    auVar8 = auVar8 ^ _DAT_0010a020;
    do {
      auVar9._8_4_ = (int)uVar7;
      auVar9._0_8_ = uVar7;
      auVar9._12_4_ = (int)(uVar7 >> 0x20);
      auVar10 = (auVar9 | auVar3) ^ auVar4;
      if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                  auVar8._4_4_ < auVar10._4_4_) & 1)) {
        ppEVar5[uVar7] = &this->tail;
      }
      if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
          auVar10._12_4_ <= auVar8._12_4_) {
        ppEVar5[uVar7 + 1] = &this->tail;
      }
      uVar7 = uVar7 + 2;
    } while (((uVar6 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
  }
  return;
}

Assistant:

SkipList::SkipList() : head(0, MAX_HEIGHT), tail(INF, 0), height(0) {
    for (auto &i : head.next) {
        i = &tail;
    }
}